

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::ScalarDiscreteQuantile::GetFunction<double,duckdb::QuantileStandardType>
          (AggregateFunction *__return_storage_ptr__,ScalarDiscreteQuantile *this,LogicalType *type)

{
  LogicalType *in_RCX;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,(LogicalType *)this);
  LogicalType::LogicalType(&local_40,(LogicalType *)this);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,double,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,in_RCX);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  __return_storage_ptr__->window =
       QuantileScalarOperation<true,duckdb::QuantileStandardType>::
       Window<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,double>;
  __return_storage_ptr__->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double>;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &type) {
		using STATE = QuantileState<INPUT_TYPE, TYPE_OP>;
		using OP = QuantileScalarOperation<true>;
		auto fun = AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP,
		                                                       AggregateDestructorType::LEGACY>(type, type);
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::Window<STATE, INPUT_TYPE, INPUT_TYPE>;
		fun.window_init = OP::WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}